

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseSignalPrefix(Ver_Man_t *pMan,char **ppWord,int *pnMsb,int *pnLsb)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int local_48;
  int nLsb;
  int nMsb;
  char *pTemp;
  char *pWord;
  int *pnLsb_local;
  int *pnMsb_local;
  char **ppWord_local;
  Ver_Man_t *pMan_local;
  
  pTemp = *ppWord;
  if (*pTemp != '[') {
    __assert_fail("pWord[0] == \'[\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                  ,0x27f,"int Ver_ParseSignalPrefix(Ver_Man_t *, char **, int *, int *)");
  }
  iVar1 = atoi(pTemp + 1);
  while( true ) {
    bVar3 = false;
    if ((*pTemp != '\0') && (bVar3 = false, *pTemp != ':')) {
      bVar3 = *pTemp != ']';
    }
    if (!bVar3) break;
    pTemp = pTemp + 1;
  }
  if (*pTemp == '\0') {
    sprintf(pMan->sError,"Cannot find closing bracket in this line.");
    Ver_ParsePrintErrorMessage(pMan);
    pMan_local._4_4_ = 0;
  }
  else {
    local_48 = iVar1;
    pcVar2 = pTemp;
    if (*pTemp != ']') {
      if (*pTemp != ':') {
        __assert_fail("*pWord == \':\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x28f,"int Ver_ParseSignalPrefix(Ver_Man_t *, char **, int *, int *)");
      }
      local_48 = atoi(pTemp + 1);
      while( true ) {
        bVar3 = false;
        if (*pTemp != '\0') {
          bVar3 = *pTemp != ']';
        }
        if (!bVar3) break;
        pTemp = pTemp + 1;
      }
      if (*pTemp == '\0') {
        sprintf(pMan->sError,"Cannot find closing bracket in this line.");
        Ver_ParsePrintErrorMessage(pMan);
        return 0;
      }
      if (*pTemp != ']') {
        __assert_fail("*pWord == \']\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x29a,"int Ver_ParseSignalPrefix(Ver_Man_t *, char **, int *, int *)");
      }
      pcVar2 = pTemp + 1;
      if (pTemp[1] == '\\') {
        pcVar2 = pTemp + 2;
        _nLsb = pcVar2;
        while( true ) {
          bVar3 = false;
          if (*_nLsb != '\0') {
            bVar3 = *_nLsb != ' ';
          }
          if (!bVar3) break;
          _nLsb = _nLsb + 1;
        }
        if (*_nLsb == ' ') {
          *_nLsb = '\0';
        }
      }
    }
    pTemp = pcVar2;
    if ((iVar1 < 0) || (local_48 < 0)) {
      __assert_fail("nMsb >= 0 && nLsb >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                    ,0x2a8,"int Ver_ParseSignalPrefix(Ver_Man_t *, char **, int *, int *)");
    }
    *ppWord = pTemp;
    *pnMsb = iVar1;
    *pnLsb = local_48;
    pMan_local._4_4_ = 1;
  }
  return pMan_local._4_4_;
}

Assistant:

int Ver_ParseSignalPrefix( Ver_Man_t * pMan, char ** ppWord, int * pnMsb, int * pnLsb )
{
    char * pWord = *ppWord, * pTemp;
    int nMsb, nLsb;
    assert( pWord[0] == '[' );
    // get the beginning
    nMsb = atoi( pWord + 1 );
    // find the splitter
    while ( *pWord && *pWord != ':' && *pWord != ']' )
        pWord++;
    if ( *pWord == 0 )
    {
        sprintf( pMan->sError, "Cannot find closing bracket in this line." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    if ( *pWord == ']' )
        nLsb = nMsb;
    else
    {
        assert( *pWord == ':' );
        nLsb = atoi( pWord + 1 );
        // find the closing parenthesis
        while ( *pWord && *pWord != ']' )
            pWord++;
        if ( *pWord == 0 )
        {
            sprintf( pMan->sError, "Cannot find closing bracket in this line." );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        assert( *pWord == ']' );
        pWord++;

        // fix the case when \<name> follows after [] without space
        if ( *pWord == '\\' )
        {
            pWord++;
            pTemp = pWord;
            while ( *pTemp && *pTemp != ' ' )
                pTemp++;
            if ( *pTemp == ' ' )
                *pTemp = 0;
        }
    }
    assert( nMsb >= 0 && nLsb >= 0 );
    // return
    *ppWord = pWord;
    *pnMsb = nMsb;
    *pnLsb = nLsb;
    return 1;
}